

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::handleDisembargo
          (RpcConnectionState *this,Reader *disembargo)

{
  HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo> *this_00;
  short sVar1;
  int iVar2;
  Embargo *pEVar3;
  Disposer *pDVar4;
  PromiseFulfiller<void> *pPVar5;
  undefined8 *puVar6;
  undefined8 uVar7;
  bool bVar8;
  uint uVar9;
  SegmentReader *pSVar10;
  ThirdPartyEmbargo *pTVar11;
  long lVar12;
  ulong uVar13;
  _func_int *p_Var14;
  StringPtr id;
  Own<capnp::ClientHook,_std::nullptr_t> target;
  Fault f;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_c__:4183:19),_void>
  promise;
  Fault f_1;
  Own<capnp::OutgoingRpcMessage,_std::nullptr_t> nextMsg;
  Reader context;
  undefined1 local_168 [24];
  WirePointer *pWStack_150;
  pointer local_148;
  undefined1 local_140 [8];
  undefined1 local_138 [16];
  Own<capnp::ClientHook,_std::nullptr_t> local_128 [2];
  undefined1 local_108 [56];
  Builder local_d0;
  Own<capnp::OutgoingRpcMessage,_std::nullptr_t> local_a8;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> local_98;
  undefined1 local_88 [48];
  Builder local_58;
  
  local_88._0_8_ = (disembargo->_reader).segment;
  local_88._8_8_ = (disembargo->_reader).capTable;
  local_88._16_8_ = (disembargo->_reader).data;
  local_88._24_8_ = (disembargo->_reader).pointers;
  local_88._32_4_ = (disembargo->_reader).dataSize;
  local_88._36_2_ = (disembargo->_reader).pointerCount;
  local_88._38_2_ = *(undefined2 *)&(disembargo->_reader).field_0x26;
  local_88._40_8_ = *(undefined8 *)&(disembargo->_reader).nestingLimit;
  if ((uint)local_88._32_4_ < 0x30) {
LAB_002c98ba:
    rpc::Disembargo::Reader::getTarget((Reader *)local_138,disembargo);
    getMessageTarget((RpcConnectionState *)local_168,(Reader *)this);
    local_138._8_4_ = 0;
    if (0x1f < (uint)local_88._32_4_) {
      local_138._8_4_ = *(undefined4 *)local_88._16_8_;
    }
    ClientHook::whenResolved((ClientHook *)local_138);
    kj::Promise<void>::
    then<capnp::_::RpcSystemBase::RpcConnectionState::handleDisembargo(capnp::rpc::Disembargo::Reader_const&)::_lambda()_1_>
              ((Promise<void> *)local_108,(anon_class_1_0_00000001_for_func *)local_138);
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_138);
    local_128[0].disposer = (Disposer *)local_168._0_8_;
    local_128[0].ptr = (ClientHook *)local_168._8_8_;
    local_168._8_8_ = (_func_int **)0x0;
    local_138._0_8_ = this;
    kj::Promise<void>::
    then<capnp::_::RpcSystemBase::RpcConnectionState::handleDisembargo(capnp::rpc::Disembargo::Reader_const&)::_lambda()_2_>
              ((Promise<void> *)&local_d0,(anon_class_32_3_62e1cf96_for_func *)local_108);
    kj::TaskSet::add(&this->tasks,(Promise<void> *)&local_d0);
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_d0);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(local_128);
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_108);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
              ((Own<capnp::ClientHook,_std::nullptr_t> *)local_168);
    return;
  }
  sVar1 = (short)*(uint *)(local_88._16_8_ + 4);
  if (sVar1 == 2) {
    id.content = (ArrayPtr<const_char>)
                 rpc::Disembargo::Context::Reader::getAccept((Reader *)local_88);
    rpc::Disembargo::Reader::getTarget((Reader *)local_138,disembargo);
    if (0x2f < (uint)local_128[1].disposer._0_4_) {
      if (*(short *)((long)local_128[0].disposer + 4) == 1) {
        rpc::MessageTarget::Reader::getPromisedAnswer((Reader *)local_168,(Reader *)local_138);
        bVar8 = rpc::PromisedAnswer::Reader::hasTransform((Reader *)local_168);
        local_d0._builder.segment =
             (SegmentBuilder *)CONCAT71(local_d0._builder.segment._1_7_,!bVar8);
        if (bVar8) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[70]>
                    ((Fault *)local_108,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0x10d0,FAILED,"!promisedAnswer.hasTransform()",
                     "_kjCondition,\"Disembargo sent to Provide operation cannot include a transformation.\""
                     ,(DebugExpression<bool> *)&local_d0,
                     (char (*) [70])
                     "Disembargo sent to Provide operation cannot include a transformation.");
          kj::_::Debug::Fault::fatal((Fault *)local_108);
        }
        anon_unknown_18::
        ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::find
                  ((ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer> *
                   )local_108,(int)this + 0x2d8);
        if ((_func_int **)local_108._0_8_ == (_func_int **)0x0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[70]>
                    ((Fault *)local_108,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0x10d3,FAILED,"answers.find(promisedAnswer.getQuestionId()) != nullptr",
                     "\"Disembargo specified a provision ID (question ID) that doesn\'t exist.\"",
                     (char (*) [70])
                     "Disembargo specified a provision ID (question ID) that doesn\'t exist.");
          kj::_::Debug::Fault::fatal((Fault *)local_108);
        }
        if (*(int *)(local_108._0_8_ + 0x10) != 4) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[78]>
                    ((Fault *)local_108,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0x10d6,FAILED,"answer.task.tryGet<Answer::Provide>() != nullptr",
                     "\"Disembargo specified a question ID that didn\'t belong to a Provide operation.\""
                     ,(char (*) [78])
                      "Disembargo specified a question ID that didn\'t belong to a Provide operation."
                    );
          kj::_::Debug::Fault::fatal((Fault *)local_108);
        }
        if (*(int *)(*(_func_int **)(local_108._0_8_ + 0x20) + 0x10) == 1) {
          pTVar11 = ThirdPartyExchangeValue::Provide::findOrCreateThirdPartyEmbargo
                              ((Provide *)(*(_func_int **)(local_108._0_8_ + 0x20) + 0x18),id);
          pPVar5 = (pTVar11->fulfiller).ptr;
          (*(pPVar5->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar5,local_108);
          return;
        }
        kj::_::Debug::Fault::Fault
                  ((Fault *)local_108,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0x10d9,FAILED,
                   "provision->value.tryGet<ThirdPartyExchangeValue::Provide>() != nullptr","");
        kj::_::Debug::Fault::fatal((Fault *)local_108);
      }
      if (*(short *)((long)local_128[0].disposer + 4) != 0) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,char_const(&)[29],capnp::rpc::MessageTarget::Reader&>
                  ((Fault *)local_168,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0x10e2,FAILED,(char *)0x0,"\"Unknown message target type.\", target",
                   (char (*) [29])"Unknown message target type.",(Reader *)local_138);
        kj::_::Debug::Fault::fatal((Fault *)local_168);
      }
    }
    anon_unknown_18::ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>
    ::find((ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export> *)
           local_168,(int)this + 0x1b8);
    if ((_func_int **)local_168._0_8_ == (_func_int **)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[43]>
                ((Fault *)local_168,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x109f,FAILED,"exports.find(target.getImportedCap()) != nullptr",
                 "\"Message target is not a current export ID.\"",
                 (char (*) [43])"Message target is not a current export ID.");
      kj::_::Debug::Fault::fatal((Fault *)local_168);
    }
    p_Var14 = *(_func_int **)(local_168._0_8_ + 0x30);
    if (p_Var14 == (_func_int *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[33]>
                ((Fault *)local_168,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x10a1,FAILED,"exp.vineInfo != nullptr","\"Disembargo target is not a vine.\"",
                 (char (*) [33])"Disembargo target is not a vine.");
      kj::_::Debug::Fault::fatal((Fault *)local_168);
    }
    iVar2 = *(int *)p_Var14;
    if (iVar2 == 2) {
      p_Var14 = *(_func_int **)(local_168._0_8_ + 0x10);
      if ((p_Var14 == (_func_int *)0x0) || (*(RpcSystemBrand **)(p_Var14 + 8) != (this->brand).ptr))
      {
        kj::_::Debug::Fault::Fault
                  ((Fault *)local_168,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0x10ad,FAILED,"unwrapIfSameNetwork(*exp.clientHook) != nullptr","");
        kj::_::Debug::Fault::fatal((Fault *)local_168);
      }
      lVar12 = *(long *)(p_Var14 + 0x28);
    }
    else {
      if (iVar2 != 1) {
        return;
      }
      p_Var14 = *(_func_int **)(p_Var14 + 0x10);
      lVar12 = *(long *)(p_Var14 + 0x18);
      if (lVar12 == 0) {
        return;
      }
    }
    if (*(int *)(lVar12 + 0x20) != 1) {
      return;
    }
    puVar6 = *(undefined8 **)(lVar12 + 0x38);
    if (puVar6 == (undefined8 *)0x0) {
      return;
    }
    (**(code **)*puVar6)(&local_a8,puVar6,(int)(id.content.size_ >> 3) + 0x1b);
    (*(code *)*(local_a8.ptr)->_vptr_OutgoingRpcMessage)(&local_d0);
    AnyPointer::Builder::initAs<capnp::rpc::Message>
              ((BuilderFor<capnp::rpc::Message> *)local_168,(Builder *)&local_d0);
    rpc::Message::Builder::initDisembargo((Builder *)local_108,(Builder *)local_168);
    local_148 = (pointer)local_108._32_8_;
    local_168._16_8_ = local_108._16_8_;
    pWStack_150 = (WirePointer *)local_108._24_8_;
    local_168._0_8_ = local_108._0_8_;
    local_168._8_8_ = local_108._8_8_;
    rpc::Disembargo::Context::Builder::setAccept((Builder *)local_168,(Reader_conflict)id.content);
    if (iVar2 == 1) {
      rpc::Disembargo::Builder::initTarget(&local_d0,(Builder *)local_108);
      rpc::MessageTarget::Builder::initPromisedAnswer((Builder *)local_168,&local_d0);
      *(uint *)local_168._16_8_ = *(uint *)(p_Var14 + 0x20);
    }
    else {
      rpc::Disembargo::Builder::initTarget(&local_58,(Builder *)local_108);
      (**(code **)(*(long *)p_Var14 + 0x50))(local_108 + 0x28,p_Var14);
      uVar7 = local_108._48_8_;
      local_108._48_8_ = (_func_int **)0x0;
      local_d0._builder.segment = (SegmentBuilder *)local_108._40_8_;
      local_d0._builder.capTable = (CapTableBuilder *)0x0;
      local_140[0] = (_func_int **)uVar7 == (_func_int **)0x0;
      local_168._0_8_ = local_108._40_8_;
      local_168._8_8_ = uVar7;
      local_168._16_8_ = &kj::none;
      pWStack_150 = (WirePointer *)0x4224f8;
      local_148 = (pointer)&DAT_00000005;
      kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
                ((Own<capnp::ClientHook,_std::nullptr_t> *)&local_d0);
      kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
                ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_108 + 0x28));
      if ((_func_int **)uVar7 != (_func_int **)0x0) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Own<capnp::ClientHook,decltype(nullptr)>>,kj::None_const&>&>
                  ((Fault *)&local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0x10c0,FAILED,"import->writeTarget(nextDisembargo.initTarget()) == kj::none",
                   "_kjCondition,",
                   (DebugComparison<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>,_const_kj::None_&>
                    *)local_168);
        kj::_::Debug::Fault::fatal((Fault *)&local_d0);
      }
      kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
                ((Own<capnp::ClientHook,_std::nullptr_t> *)local_168);
    }
    (**(code **)(*(long *)local_a8.ptr + 0x10))();
    kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::dispose(&local_a8);
    return;
  }
  if (sVar1 != 1) {
    if (sVar1 != 0) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,char_const(&)[31],capnp::rpc::Disembargo::Reader_const&>
                ((Fault *)local_138,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x10e9,FAILED,(char *)0x0,"\"Unimplemented Disembargo type.\", disembargo",
                 (char (*) [31])"Unimplemented Disembargo type.",disembargo);
      kj::_::Debug::Fault::fatal((Fault *)local_138);
    }
    goto LAB_002c98ba;
  }
  uVar9 = *(uint *)local_88._16_8_;
  uVar13 = (ulong)(int)uVar9;
  local_168._0_4_ = uVar9;
  if ((long)uVar13 < 0) {
    kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::
    find<unsigned_int&>((HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>
                         *)local_138,(uint *)&(this->embargoes).highSlots);
    pSVar10 = (SegmentReader *)local_138._0_8_;
    if ((SegmentReader *)local_138._0_8_ == (SegmentReader *)0x0) goto LAB_002ca019;
  }
  else {
    pEVar3 = (this->embargoes).slots.builder.ptr;
    if (((ulong)((long)(this->embargoes).slots.builder.pos - (long)pEVar3 >> 4) <= uVar13) ||
       (pEVar3[uVar13].fulfiller.ptr.ptr == (PromiseFulfiller<void> *)0x0)) {
LAB_002ca019:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[61]>
                ((Fault *)local_138,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x1093,FAILED,(char *)0x0,
                 "\"Invalid embargo ID in \'Disembargo.context.receiverLoopback\'.\"",
                 (char (*) [61])"Invalid embargo ID in \'Disembargo.context.receiverLoopback\'.");
      kj::_::Debug::Fault::fatal((Fault *)local_138);
    }
    pSVar10 = (SegmentReader *)(pEVar3 + uVar13);
  }
  pDVar4 = (((Embargo *)&pSVar10->id)->fulfiller).ptr.disposer;
  if (pDVar4 == (Disposer *)0x0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)local_138,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
               ,0x108f,FAILED,"embargo.fulfiller != nullptr","");
    kj::_::Debug::Fault::fatal((Fault *)local_138);
  }
  (*((PromiseRejector *)&pDVar4->_vptr_Disposer)->_vptr_PromiseRejector[2])(pDVar4,local_138);
  if ((uint)local_88._32_4_ < 0x20) {
    local_168._0_8_ = (ulong)(uint)local_168._4_4_ << 0x20;
    uVar9 = 0;
  }
  else {
    uVar9 = *(uint *)local_88._16_8_;
    local_168._0_4_ = uVar9;
    if ((int)uVar9 < 0) {
      this_00 = &(this->embargoes).highSlots;
      kj::
      Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>>
      ::find<0ul,unsigned_int&>
                ((Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>>
                  *)local_138,(uint *)this_00);
      if ((SegmentReader *)local_138._0_8_ == (SegmentReader *)0x0) {
        kj::_::Debug::Fault::Fault
                  ((Fault *)local_138,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0xed,FAILED,"highSlots.findEntry(id) != nullptr","");
        kj::_::Debug::Fault::fatal((Fault *)local_138);
      }
      kj::
      Table<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>_>
      ::release((Entry *)local_138,&this_00->table,(Entry *)local_138._0_8_);
      local_98.disposer = (Disposer *)local_138._8_8_;
      local_98.ptr = (PromiseFulfiller<void> *)local_128[0].disposer;
      local_128[0].disposer = (Disposer *)0x0;
      kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose
                ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)(local_138 + 8));
      goto LAB_002c9b5e;
    }
  }
  pEVar3 = (this->embargoes).slots.builder.ptr;
  local_98.disposer = pEVar3[uVar9].fulfiller.ptr.disposer;
  local_98.ptr = pEVar3[uVar9].fulfiller.ptr.ptr;
  pEVar3[uVar9].fulfiller.ptr.ptr = (PromiseFulfiller<void> *)0x0;
  local_138._0_8_ = (SegmentReader *)0x0;
  local_138._8_8_ = (CapTableReader *)0x0;
  kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=
            ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)(pEVar3 + uVar9),
             (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)local_138);
  kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose
            ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)local_138);
  std::
  priority_queue<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::greater<unsigned_int>_>
  ::push(&(this->embargoes).freeIds,(value_type *)local_168);
LAB_002c9b5e:
  kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose(&local_98);
  checkIfBecameIdle(this);
  return;
}

Assistant:

void handleDisembargo(const rpc::Disembargo::Reader& disembargo) {
    auto context = disembargo.getContext();
    switch (context.which()) {
      case rpc::Disembargo::Context::SENDER_LOOPBACK: {
        kj::Own<ClientHook> target = getMessageTarget(disembargo.getTarget());

        EmbargoId embargoId = context.getSenderLoopback();

        // It's possible that `target` is a promise capability that hasn't resolved yet, in which
        // case we must wait for the resolution. In particular this can happen in the case where
        // we have Alice -> Bob -> Carol, Alice makes a call that proxies from Bob to Carol, and
        // Carol returns a capability from this call that points all the way back though Bob to
        // Alice. When this return capability passes through Bob, Bob will resolve the previous
        // promise-pipeline capability to it. However, Bob has to send a Disembargo to Carol before
        // completing this resolution. In the meantime, though, Bob returns the final response to
        // Alice. Alice then *also* sends a Disembargo to Bob. The Alice -> Bob Disembargo might
        // arrive at Bob before the Bob -> Carol Disembargo has resolved, in which case the
        // Disembargo is delivered to a promise capability.
        auto promise = target->whenResolved()
            .then([]() {
          // We also need to insert yieldUntilQueueEmpty() here to make sure that any pending calls
          // towards this cap have had time to find their way through the event loop.
          return kj::yieldUntilQueueEmpty();
        });

        tasks.add(promise.then([this, embargoId, target = kj::mv(target)]() mutable {
          for (;;) {
            KJ_IF_SOME(r, target->getResolved()) {
              target = r.addRef();
            } else {
              break;
            }
          }

          KJ_REQUIRE(unwrapIfSameConnection(*target) != kj::none,
                    "'Disembargo' of type 'senderLoopback' sent to an object that does not point "
                    "back to the sender.") {
            return;
          }

          if (!connection.is<Connected>()) {
            return;
          }

          RpcClient& downcasted = kj::downcast<RpcClient>(*target);

          auto message = connection.get<Connected>().connection->newOutgoingMessage(
              messageSizeHint<rpc::Disembargo>() + MESSAGE_TARGET_SIZE_HINT);
          auto builder = message->getBody().initAs<rpc::Message>().initDisembargo();

          {
            auto redirect = downcasted.writeTarget(builder.initTarget());

            // Disembargoes should only be sent to capabilities that were previously the subject of
            // a `Resolve` message.  But `writeTarget` only ever returns non-null when called on
            // a PromiseClient.  The code which sends `Resolve` and `Return` should have replaced
            // any promise with a direct node in order to solve the Tribble 4-way race condition.
            // See the documentation of Disembargo in rpc.capnp for more.
            KJ_REQUIRE(redirect == kj::none,
                      "'Disembargo' of type 'senderLoopback' sent to an object that does not "
                      "appear to have been the subject of a previous 'Resolve' message.") {
              return;
            }
          }

          builder.getContext().setReceiverLoopback(embargoId);

          message->send();
        }));

        break;
      }

      case rpc::Disembargo::Context::RECEIVER_LOOPBACK: {
        KJ_IF_SOME(embargo, embargoes.find(context.getReceiverLoopback())) {
          KJ_ASSERT_NONNULL(embargo.fulfiller)->fulfill();
          embargoes.erase(context.getReceiverLoopback(), embargo);
          checkIfBecameIdle();
        } else {
          KJ_FAIL_REQUIRE("Invalid embargo ID in 'Disembargo.context.receiverLoopback'.");
        }
        break;
      }